

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadePrimitives
          (VertexVaryingShader *this,GeometryEmitter *output,int verticesIn,PrimitivePacket *packets
          ,int numPackets,int invocationID)

{
  int iVar1;
  VertexPacket *pVVar2;
  int i_1;
  long lVar3;
  PrimitivePacket *pPVar4;
  ulong uVar5;
  Vector<float,_4> res_2;
  Vector<float,_4> res;
  Vec4 inputColor;
  GenericVec4 outputs [2];
  Vec4 vertexOffset;
  Vector<float,_4> res_1;
  Vec4 local_f8;
  ulong local_e8;
  float afStack_e0 [5];
  int local_cc;
  undefined8 local_c8;
  float afStack_c0 [4];
  ulong local_b0;
  anon_union_16_3_1194ccdc_for_v local_a8;
  float local_98 [4];
  PrimitivePacket *local_88;
  float local_80;
  int local_7c;
  int local_78;
  float local_74;
  float local_70 [4];
  ulong local_60;
  float local_58 [6];
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_70[0] = -0.2;
  local_70[1] = -0.2;
  local_70[2] = 0.0;
  local_70[3] = 0.0;
  local_cc = verticesIn;
  local_88 = packets;
  if (*(int *)&(this->super_ShaderProgram).field_0x154 == -1) {
    local_c8 = 0x3f800000;
    afStack_c0[0] = 0.0;
    afStack_c0[1] = 1.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_a8.uData[0] = (deUint32)0.0;
    local_a8.uData[1] = (deUint32)0.0;
    local_a8.uData[2] = (deUint32)0.0;
    local_a8.uData[3] = (deUint32)0.0;
    if (this->m_geometryOut == 2) {
      local_f8.m_data[0] = 0.0;
      local_f8.m_data[1] = 0.0;
      local_f8.m_data[2] = 0.0;
      local_f8.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        local_f8.m_data[lVar3] = *(float *)((long)&local_c8 + lVar3 * 4) * 0.5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_a8.uData[0] = (deUint32)local_f8.m_data[0];
      local_a8.uData[1] = (deUint32)local_f8.m_data[1];
      local_a8.uData[2] = (deUint32)local_f8.m_data[2];
      local_a8.uData[3] = (deUint32)local_f8.m_data[3];
      local_e8 = 0x3f80000000000000;
      afStack_e0[0] = 0.0;
      afStack_e0[1] = 1.0;
      local_f8.m_data[0] = 0.0;
      local_f8.m_data[1] = 0.0;
      local_f8.m_data[2] = 0.0;
      local_f8.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        local_f8.m_data[lVar3] = *(float *)((long)&local_e8 + lVar3 * 4) * 0.5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_98[0] = local_f8.m_data[0];
      local_98[1] = local_f8.m_data[1];
      local_98[2] = local_f8.m_data[2];
      local_98[3] = local_f8.m_data[3];
    }
    else if (this->m_geometryOut == 1) {
      local_a8.uData[0] = (deUint32)1.0;
      local_a8.uData[1] = (deUint32)0.0;
      local_a8.uData[2] = (deUint32)0.0;
      local_a8.uData[3] = (deUint32)1.0;
    }
    if (0 < numPackets) {
      uVar5 = 0;
      do {
        local_e8 = 0;
        afStack_e0[0] = 0.0;
        afStack_e0[1] = 1.0;
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_f8.m_data[lVar3] = *(float *)((long)&local_e8 + lVar3 * 4) + local_70[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        pPVar4 = local_88 + uVar5;
        rr::GeometryEmitter::EmitVertex
                  (output,&local_f8,1.0,(GenericVec4 *)&local_a8,local_88[uVar5].primitiveIDIn);
        local_e8 = 0x3f800000;
        afStack_e0[0] = 0.0;
        afStack_e0[1] = 1.0;
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_f8.m_data[lVar3] = *(float *)((long)&local_e8 + lVar3 * 4) + local_70[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        rr::GeometryEmitter::EmitVertex
                  (output,&local_f8,1.0,(GenericVec4 *)&local_a8,pPVar4->primitiveIDIn);
        local_e8 = 0x3f8000003f800000;
        afStack_e0[0] = 0.0;
        afStack_e0[1] = 1.0;
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_f8.m_data[lVar3] = *(float *)((long)&local_e8 + lVar3 * 4) + local_70[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        rr::GeometryEmitter::EmitVertex
                  (output,&local_f8,1.0,(GenericVec4 *)&local_a8,pPVar4->primitiveIDIn);
        rr::GeometryEmitter::EndPrimitive(output);
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)numPackets);
    }
  }
  else if (0 < numPackets) {
    local_60 = (ulong)(uint)numPackets;
    local_b0 = 0;
    do {
      if (0 < local_cc) {
        pPVar4 = local_88 + local_b0;
        uVar5 = 0;
        do {
          local_c8 = 0;
          afStack_c0[0] = 0.0;
          afStack_c0[1] = 0.0;
          local_98[0] = 0.0;
          local_98[1] = 0.0;
          local_98[2] = 0.0;
          local_98[3] = 0.0;
          local_a8._0_8_ = 0;
          local_a8.uData[2] = (deUint32)0.0;
          local_a8.uData[3] = (deUint32)0.0;
          iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
          if (iVar1 == 2) {
            pVVar2 = pPVar4->vertices[uVar5];
            local_40 = *(undefined8 *)&pVVar2->outputs[0].v;
            uStack_38 = *(undefined8 *)((long)&pVVar2->outputs[0].v + 8);
            local_e8 = 0;
            afStack_e0[0] = 0.0;
            afStack_e0[1] = 0.0;
            lVar3 = 0;
            do {
              *(float *)((long)&local_e8 + lVar3 * 4) =
                   *(float *)((long)&local_40 + lVar3 * 4) * 0.5;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            local_80 = pVVar2[1].position.m_data[0];
            local_7c = pVVar2[1].vertexNdx;
            local_78 = pVVar2[1].instanceNdx;
            local_74 = pVVar2[1].position.m_data[1];
            local_58[0] = 0.0;
            local_58[1] = 0.0;
            local_58[2] = 0.0;
            local_58[3] = 0.0;
            lVar3 = 0;
            do {
              local_58[lVar3] = (&local_80)[lVar3] * 0.5;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            local_f8.m_data[0] = 0.0;
            local_f8.m_data[1] = 0.0;
            local_f8.m_data[2] = 0.0;
            local_f8.m_data[3] = 0.0;
            lVar3 = 0;
            do {
              local_f8.m_data[lVar3] = *(float *)((long)&local_e8 + lVar3 * 4) + local_58[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
LAB_003acc86:
            local_c8 = CONCAT44(local_f8.m_data[1],local_f8.m_data[0]);
            afStack_c0[1] = local_f8.m_data[3];
            afStack_c0[0] = local_f8.m_data[2];
          }
          else {
            if (iVar1 == 1) {
              pVVar2 = pPVar4->vertices[uVar5];
              local_f8.m_data[0] = (float)pVVar2->outputs[0].v.uData[0];
              local_f8.m_data[1] = (float)pVVar2->outputs[0].v.uData[1];
              local_f8.m_data[2] = (float)pVVar2->outputs[0].v.uData[2];
              local_f8.m_data[3] = (float)pVVar2->outputs[0].v.uData[3];
              goto LAB_003acc86;
            }
            if (iVar1 == 0) {
              local_f8.m_data[0] = 1.0;
              local_f8.m_data[1] = 0.0;
              local_f8.m_data[2] = 0.0;
              local_f8.m_data[3] = 1.0;
              goto LAB_003acc86;
            }
          }
          if (this->m_geometryOut == 2) {
            local_f8.m_data[0] = 0.0;
            local_f8.m_data[1] = 0.0;
            local_f8.m_data[2] = 0.0;
            local_f8.m_data[3] = 0.0;
            lVar3 = 0;
            do {
              local_f8.m_data[lVar3] = *(float *)((long)&local_c8 + lVar3 * 4) * 0.5;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            local_a8.uData[0] = (deUint32)local_f8.m_data[0];
            local_a8.uData[1] = (deUint32)local_f8.m_data[1];
            local_a8.uData[2] = (deUint32)local_f8.m_data[2];
            local_a8.uData[3] = (deUint32)local_f8.m_data[3];
            local_e8 = local_c8 << 0x20 | local_c8 >> 0x20;
            afStack_e0[0] = afStack_c0[0];
            afStack_e0[1] = afStack_c0[1];
            local_f8.m_data[0] = 0.0;
            local_f8.m_data[1] = 0.0;
            local_f8.m_data[2] = 0.0;
            local_f8.m_data[3] = 0.0;
            lVar3 = 0;
            do {
              local_f8.m_data[lVar3] = *(float *)((long)&local_e8 + lVar3 * 4) * 0.5;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            local_98[0] = local_f8.m_data[0];
            local_98[1] = local_f8.m_data[1];
            local_98[2] = local_f8.m_data[2];
            local_98[3] = local_f8.m_data[3];
          }
          else if (this->m_geometryOut == 1) {
            local_a8._0_8_ = local_c8;
            local_a8.uData[2] = (deUint32)afStack_c0[0];
            local_a8.uData[3] = (deUint32)afStack_c0[1];
          }
          pVVar2 = pPVar4->vertices[uVar5];
          local_f8.m_data[0] = 0.0;
          local_f8.m_data[1] = 0.0;
          local_f8.m_data[2] = 0.0;
          local_f8.m_data[3] = 0.0;
          lVar3 = 0;
          do {
            local_f8.m_data[lVar3] = (pVVar2->position).m_data[lVar3] + local_70[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          rr::GeometryEmitter::EmitVertex
                    (output,&local_f8,pVVar2->pointSize,(GenericVec4 *)&local_a8,
                     pPVar4->primitiveIDIn);
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)verticesIn);
      }
      rr::GeometryEmitter::EndPrimitive(output);
      local_b0 = local_b0 + 1;
    } while (local_b0 != local_60);
  }
  return;
}

Assistant:

void VertexVaryingShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(invocationID);

	const tcu::Vec4 vertexOffset(-0.2f, -0.2f, 0, 0);

	if (m_vertexOut == -1)
	{
		// vertex is a no-op
		const tcu::Vec4 inputColor = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
		rr::GenericVec4	outputs[2];

		// output color
		switch (m_geometryOut)
		{
			case 0:
				break;

			case 1:
				outputs[0] = inputColor;
				break;

			case 2:
				outputs[0] = inputColor * 0.5f;
				outputs[1] = inputColor.swizzle(1, 0, 2, 3) * 0.5f;
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		for (int ndx = 0; ndx < numPackets; ++ndx)
		{
			output.EmitVertex(tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EmitVertex(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EmitVertex(tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EndPrimitive();
		}
	}
	else
	{
		// vertex is not a no-op
		for (int ndx = 0; ndx < numPackets; ++ndx)
		{
			for (int verticeNdx = 0; verticeNdx < verticesIn; ++verticeNdx)
			{
				tcu::Vec4		inputColor;
				rr::GenericVec4	outputs[2];

				// input color
				switch (m_vertexOut)
				{
					case 0:
						inputColor = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
						break;

					case 1:
						inputColor = packets[ndx].vertices[verticeNdx]->outputs[0].get<float>();
						break;

					case 2:
						inputColor = (packets[ndx].vertices[verticeNdx]->outputs[0].get<float>() * 0.5f)
								   + (packets[ndx].vertices[verticeNdx]->outputs[1].get<float>().swizzle(2, 1, 0, 3) * 0.5f);
						break;

					default:
						DE_ASSERT(DE_FALSE);
				}

				// output color
				switch (m_geometryOut)
				{
					case 0:
						break;

					case 1:
						outputs[0] = inputColor;
						break;

					case 2:
						outputs[0] = inputColor * 0.5f;
						outputs[1] = inputColor.swizzle(1, 0, 2, 3) * 0.5f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
				}

				output.EmitVertex(packets[ndx].vertices[verticeNdx]->position + vertexOffset, packets[ndx].vertices[verticeNdx]->pointSize, outputs, packets[ndx].primitiveIDIn);
			}
			output.EndPrimitive();
		}
	}
}